

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

LocalVariableDeclarationSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::LocalVariableDeclarationSyntax,slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>const&,slang::parsing::Token&,slang::syntax::DataTypeSyntax&,slang::syntax::SeparatedSyntaxList<slang::syntax::DeclaratorSyntax>const&,slang::parsing::Token&>
          (BumpAllocator *this,SyntaxList<slang::syntax::AttributeInstanceSyntax> *args,
          Token *args_1,DataTypeSyntax *args_2,
          SeparatedSyntaxList<slang::syntax::DeclaratorSyntax> *args_3,Token *args_4)

{
  Token var;
  Token semi;
  LocalVariableDeclarationSyntax *this_00;
  Token *args_local_4;
  SeparatedSyntaxList<slang::syntax::DeclaratorSyntax> *args_local_3;
  DataTypeSyntax *args_local_2;
  Token *args_local_1;
  SyntaxList<slang::syntax::AttributeInstanceSyntax> *args_local;
  BumpAllocator *this_local;
  
  this_00 = (LocalVariableDeclarationSyntax *)allocate(this,0x98,8);
  var.kind = args_1->kind;
  var._2_1_ = args_1->field_0x2;
  var.numFlags.raw = (args_1->numFlags).raw;
  var.rawLen = args_1->rawLen;
  var.info = args_1->info;
  semi.kind = args_4->kind;
  semi._2_1_ = args_4->field_0x2;
  semi.numFlags.raw = (args_4->numFlags).raw;
  semi.rawLen = args_4->rawLen;
  semi.info = args_4->info;
  slang::syntax::LocalVariableDeclarationSyntax::LocalVariableDeclarationSyntax
            (this_00,args,var,args_2,args_3,semi);
  return this_00;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }